

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRouter.h
# Opt level: O2

void __thiscall
uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::add
          (HttpRouter<uWS::HttpContextData<true>::RouterData> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *methods,string *pattern,unique_function<bool_(HttpRouter<RouterData>_*)> *handler,
          uint32_t priority)

{
  pointer pcVar1;
  pointer pbVar2;
  Node *parent;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __position;
  int i;
  int urlSegment;
  string method;
  uint local_dc;
  vector<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,bool(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>*)>>,std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,bool(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>*)>>>>
  *local_d8;
  unique_function<bool_(HttpRouter<RouterData>_*)> *local_d0;
  string *local_c8;
  Node *local_c0;
  pointer local_b8;
  pointer local_b0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> local_a8;
  string local_90;
  string local_70 [32];
  string local_50;
  
  local_b8 = (methods->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_c0 = &this->root;
  local_d8 = (vector<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,bool(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>*)>>,std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,bool(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>*)>>>>
              *)&this->handlers;
  pbVar2 = (methods->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_d0 = handler;
  local_c8 = pattern;
  while (pbVar2 != local_b8) {
    local_b0 = pbVar2;
    std::__cxx11::string::string(local_70,(string *)pbVar2);
    std::__cxx11::string::string((string *)&local_90,local_70);
    parent = getNode(this,local_c0,&local_90,false);
    std::__cxx11::string::~string((string *)&local_90);
    pcVar1 = (local_c8->_M_dataplus)._M_p;
    (this->currentUrl)._M_len = local_c8->_M_string_length;
    (this->currentUrl)._M_str = pcVar1;
    this->urlSegmentTop = -1;
    urlSegment = 0;
    while( true ) {
      getUrlSegment(&local_a8,this,urlSegment);
      if (local_a8.second == true) break;
      getUrlSegment(&local_a8,this,urlSegment);
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_50,&local_a8.first,(allocator<char> *)&local_dc);
      parent = getNode(this,parent,&local_50,priority == 0xd0000000);
      std::__cxx11::string::~string((string *)&local_50);
      urlSegment = urlSegment + 1;
    }
    local_a8.first._M_len._0_4_ =
         (uint)((ulong)((long)(this->handlers).
                              super__Vector_base<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->handlers).
                             super__Vector_base<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5) | priority;
    __position = std::
                 __upper_bound<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int,__gnu_cxx::__ops::_Val_less_iter>
                           ((parent->handlers).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (parent->handlers).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish,&local_a8);
    local_dc = (uint)((ulong)((long)(this->handlers).
                                    super__Vector_base<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->handlers).
                                   super__Vector_base<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5) | priority;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_insert_rval
              (&parent->handlers,(const_iterator)__position._M_current,&local_dc);
    std::__cxx11::string::~string(local_70);
    pbVar2 = local_b0 + 1;
  }
  std::
  vector<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,bool(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>*)>>,std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,bool(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>*)>>>>
  ::
  emplace_back<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,false,fu2::capacity_default>,fu2::abi_400::detail::property<true,false,bool(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>*)>>>
            (local_d8,(function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>
                       *)local_d0);
  return;
}

Assistant:

void add(std::vector<std::string> methods, std::string pattern, fu2::unique_function<bool(HttpRouter *)> &&handler, uint32_t priority = MEDIUM_PRIORITY) {
        for (std::string method : methods) {
            /* Lookup method */
            Node *node = getNode(&root, method, false);
            /* Iterate over all segments */
            setUrl(pattern);
            for (int i = 0; !getUrlSegment(i).second; i++) {
                node = getNode(node, std::string(getUrlSegment(i).first), priority == HIGH_PRIORITY);
            }
            /* Insert handler in order sorted by priority (most significant 1 byte) */
            node->handlers.insert(std::upper_bound(node->handlers.begin(), node->handlers.end(), (uint32_t) (priority | handlers.size())), (uint32_t) (priority | handlers.size()));
        }

        /* Alloate this handler */
        handlers.emplace_back(std::move(handler));
    }